

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  pointer pp_Var2;
  
  lVar1 = -(long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                 super__Vector_impl_data._M_start;
  for (pp_Var2 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pp_Var2 !=
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish; pp_Var2 = pp_Var2 + 1) {
    (**pp_Var2)();
    lVar1 = lVar1 + -8;
  }
  fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
          (ulong)-(lVar1 + (long)g_testlist.
                                 super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

  return RUN_ALL_TESTS();
}